

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IXSocket.cpp
# Opt level: O3

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
ix::Socket::readBytes_abi_cxx11_
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Socket *this,size_t length,OnProgressCallback *onProgressCallback
          ,CancellationRequest *isCancellationRequested)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  int extraout_var;
  int *piVar5;
  fd_set *__writefds;
  CancellationRequest *__exceptfds;
  timeval *in_R9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  void *local_78;
  long lStack_70;
  long local_68;
  int local_5c;
  _Alloc_hider local_58;
  undefined7 local_50;
  undefined1 uStack_49;
  size_type local_48;
  undefined8 uStack_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  
  local_38 = &this->_readBuffer;
  __exceptfds = isCancellationRequested;
  if ((this->_readBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->_readBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_38,0x8000);
  }
  local_78 = (void *)0x0;
  lStack_70 = 0;
  local_68 = 0;
  do {
    if (lStack_70 - (long)local_78 == length) {
      local_58._M_p = (pointer)&local_48;
      ::std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((string *)&local_58);
      __return_storage_ptr__->first = true;
      paVar1 = &(__return_storage_ptr__->second).field_2;
      (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
      if ((size_type *)local_58._M_p == &local_48) {
        paVar1->_M_allocated_capacity = local_48;
        *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = uStack_40;
      }
      else {
        (__return_storage_ptr__->second)._M_dataplus._M_p = local_58._M_p;
        (__return_storage_ptr__->second).field_2._M_allocated_capacity = local_48;
      }
      (__return_storage_ptr__->second)._M_string_length = CONCAT17(uStack_49,local_50);
      goto LAB_0018d50f;
    }
    if (((isCancellationRequested->super__Function_base)._M_manager != (_Manager_type)0x0) &&
       (bVar2 = (*isCancellationRequested->_M_invoker)((_Any_data *)isCancellationRequested), bVar2)
       ) break;
    uVar4 = (length - lStack_70) + (long)local_78;
    if (0x7fff < uVar4) {
      uVar4 = 0x8000;
    }
    iVar3 = (*this->_vptr_Socket[6])
                      (this,(this->_readBuffer).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,uVar4);
    if (CONCAT44(extraout_var,iVar3) == 0 || extraout_var < 0) {
      piVar5 = __errno_location();
      if ((*piVar5 != 0xb) && (*piVar5 != 0x73)) break;
    }
    __writefds = (fd_set *)
                 ((local_38->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start + CONCAT44(extraout_var,iVar3));
    ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_78,lStack_70);
    if ((onProgressCallback->super__Function_base)._M_manager != (_Manager_type)0x0) {
      local_58._M_p._0_4_ = (int)lStack_70 - (int)local_78;
      local_5c = (int)length;
      (*onProgressCallback->_M_invoker)((_Any_data *)onProgressCallback,(int *)&local_58,&local_5c);
    }
    iVar3 = select(this,1,(fd_set *)0x1,__writefds,(fd_set *)__exceptfds,in_R9);
  } while (iVar3 != 3);
  __return_storage_ptr__->first = false;
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  *(size_type **)((long)&(__return_storage_ptr__->second).field_2 + 1) =
       (size_type *)CONCAT44(local_58._M_p._4_4_,(int)local_58._M_p);
  *(ulong *)((long)&(__return_storage_ptr__->second).field_2 + 8) =
       CONCAT71(local_50,local_58._M_p._7_1_);
  (__return_storage_ptr__->second)._M_string_length = 0;
  local_58._M_p = (pointer)CONCAT44(local_58._M_p._4_4_,(int)local_58._M_p);
LAB_0018d50f:
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> Socket::readBytes(
        size_t length,
        const OnProgressCallback& onProgressCallback,
        const CancellationRequest& isCancellationRequested)
    {
        if (_readBuffer.empty())
        {
            _readBuffer.resize(kChunkSize);
        }

        std::vector<uint8_t> output;
        while (output.size() != length)
        {
            if (isCancellationRequested && isCancellationRequested())
            {
                return std::make_pair(false, std::string());
            }

            size_t size = std::min(kChunkSize, length - output.size());
            ssize_t ret = recv((char*)&_readBuffer[0], size);

            if (ret <= 0 && !Socket::isWaitNeeded())
            {
                // Error
                return std::make_pair(false, std::string());
            }
            else
            {
                output.insert(output.end(),
                              _readBuffer.begin(),
                              _readBuffer.begin() + ret);
            }

            if (onProgressCallback) onProgressCallback((int) output.size(), (int) length);

            // Wait with a 1ms timeout until the socket is ready to read.
            // This way we are not busy looping
            if (isReadyToRead(1) == PollResultType::Error)
            {
                return std::make_pair(false, std::string());
            }
        }

        return std::make_pair(true, std::string(output.begin(),
                                                output.end()));
    }